

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

void __thiscall GGSock::FileServer::~FileServer(FileServer *this)

{
  bool bVar1;
  pointer pIVar2;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> *in_RDI;
  thread *worker;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> local_18
  ;
  vector<std::thread,_std::allocator<std::thread>_> *local_10;
  
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x134358);
  std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffcf);
  pIVar2 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134370);
  local_10 = &pIVar2->workers;
  local_18._M_current =
       (thread *)
       std::vector<std::thread,_std::allocator<std::thread>_>::begin
                 ((vector<std::thread,_std::allocator<std::thread>_> *)
                  CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::vector<std::thread,_std::allocator<std::thread>_>::end
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&local_18);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&local_18);
  }
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  ~unique_ptr((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
               *)in_RDI);
  return;
}

Assistant:

FileServer::~FileServer() {
    m_impl->isRunning = false;

    for (auto & worker : m_impl->workers) {
        worker.join();
    }
}